

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

bool __thiscall duckdb::AsOfLocalSourceState::CombineLeftPartitions(AsOfLocalSourceState *this)

{
  atomic<unsigned_long> *paVar1;
  AsOfGlobalSinkState *pAVar2;
  ulong uVar3;
  reference this_00;
  pointer this_01;
  ulong uVar4;
  
  pAVar2 = this->gsource->gsink;
  uVar4 = (long)(pAVar2->lhs_buffers).
                super_vector<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pAVar2->lhs_buffers).
                super_vector<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar3 = (this->gsource->combined).super___atomic_base<unsigned_long>._M_i;
  while ((uVar3 < uVar4 && (((this->client->interrupted)._M_base._M_i & 1U) == 0))) {
    LOCK();
    paVar1 = &this->gsource->next_combine;
    uVar3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    if (uVar3 < uVar4) {
      this_00 = vector<duckdb::unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>,_true>
                ::operator[](&this->gsource->gsink->lhs_buffers,uVar3);
      this_01 = unique_ptr<duckdb::PartitionLocalSinkState,_std::default_delete<duckdb::PartitionLocalSinkState>,_true>
                ::operator->(this_00);
      PartitionLocalSinkState::Combine(this_01);
      LOCK();
      paVar1 = &this->gsource->combined;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
    }
    else {
      TaskScheduler::GetScheduler(this->client);
      TaskScheduler::YieldThread();
    }
    uVar3 = (this->gsource->combined).super___atomic_base<unsigned_long>._M_i;
  }
  return (bool)(~(this->client->interrupted)._M_base._M_i & 1);
}

Assistant:

bool AsOfLocalSourceState::CombineLeftPartitions() {
	const auto buffer_count = gsource.gsink.lhs_buffers.size();
	while (gsource.combined < buffer_count && !client.interrupted) {
		const auto next_combine = gsource.next_combine++;
		if (next_combine < buffer_count) {
			gsource.gsink.lhs_buffers[next_combine]->Combine();
			++gsource.combined;
		} else {
			TaskScheduler::GetScheduler(client).YieldThread();
		}
	}

	return !client.interrupted;
}